

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::GetFieldName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *descriptor)

{
  Type TVar1;
  Descriptor *this_00;
  string *psVar2;
  FieldDescriptor *descriptor_local;
  
  TVar1 = FieldDescriptor::type((FieldDescriptor *)this);
  if (TVar1 == TYPE_GROUP) {
    this_00 = FieldDescriptor::message_type((FieldDescriptor *)this);
    psVar2 = Descriptor::name_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  else {
    psVar2 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)this);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFieldName(const FieldDescriptor* descriptor) {
  if (descriptor->type() == FieldDescriptor::TYPE_GROUP) {
    return descriptor->message_type()->name();
  } else {
    return descriptor->name();
  }
}